

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalize
          (FilteredNormalizer2 *this,UnicodeString *src,UnicodeString *dest,
          USetSpanCondition spanCondition,UErrorCode *errorCode)

{
  short sVar1;
  Normalizer2 *pNVar2;
  uint uVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  UnicodeString *src_00;
  int iVar6;
  ulong uVar7;
  uint start;
  uint uVar8;
  UnicodeString tempDest;
  UnicodeString local_b0;
  UnicodeString local_70;
  undefined4 extraout_var;
  
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = (uint)sVar1;
  if (sVar1 < 0) {
    iVar6 = (src->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)uVar3 >> 5;
  }
  if (0 < iVar6) {
    start = 0;
    do {
      pcVar5 = (char16_t *)((long)&src->fUnion + 2);
      if ((uVar3 & 2) == 0) {
        pcVar5 = (src->fUnion).fFields.fArray;
      }
      if ((uVar3 & 0x11) != 0) {
        pcVar5 = (char16_t *)0x0;
      }
      uVar7 = 0;
      if (0 < (int)start) {
        uVar7 = (ulong)start;
      }
      iVar4 = UnicodeSet::span(this->set,pcVar5 + uVar7,iVar6 - (int)uVar7,spanCondition);
      uVar8 = iVar4 + (int)uVar7;
      if (spanCondition == USET_SPAN_NOT_CONTAINED) {
        spanCondition = USET_SPAN_SIMPLE;
        if (uVar8 != start) {
          UnicodeString::doAppend(dest,src,start,uVar8 - start);
        }
      }
      else {
        spanCondition = USET_SPAN_NOT_CONTAINED;
        if (uVar8 != start) {
          pNVar2 = this->norm2;
          UnicodeString::tempSubString(&local_70,src,start,uVar8 - start);
          iVar6 = (*(pNVar2->super_UObject)._vptr_UObject[3])(pNVar2,&local_70,&local_b0,errorCode);
          src_00 = (UnicodeString *)CONCAT44(extraout_var,iVar6);
          spanCondition = USET_SPAN_NOT_CONTAINED;
          sVar1 = (src_00->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar4 = (src_00->fUnion).fFields.fLength;
          }
          else {
            iVar4 = (int)sVar1 >> 5;
          }
          UnicodeString::doAppend(dest,src_00,0,iVar4);
          UnicodeString::~UnicodeString(&local_70);
          if (U_ZERO_ERROR < *errorCode) break;
        }
      }
      sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = (uint)sVar1;
      if (sVar1 < 0) {
        iVar6 = (src->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)uVar3 >> 5;
      }
      start = uVar8;
    } while ((int)uVar8 < iVar6);
  }
  UnicodeString::~UnicodeString(&local_b0);
  return dest;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalize(const UnicodeString &src,
                               UnicodeString &dest,
                               USetSpanCondition spanCondition,
                               UErrorCode &errorCode) const {
    UnicodeString tempDest;  // Don't throw away destination buffer between iterations.
    for(int32_t prevSpanLimit=0; prevSpanLimit<src.length();) {
        int32_t spanLimit=set.span(src, prevSpanLimit, spanCondition);
        int32_t spanLength=spanLimit-prevSpanLimit;
        if(spanCondition==USET_SPAN_NOT_CONTAINED) {
            if(spanLength!=0) {
                dest.append(src, prevSpanLimit, spanLength);
            }
            spanCondition=USET_SPAN_SIMPLE;
        } else {
            if(spanLength!=0) {
                // Not norm2.normalizeSecondAndAppend() because we do not want
                // to modify the non-filter part of dest.
                dest.append(norm2.normalize(src.tempSubStringBetween(prevSpanLimit, spanLimit),
                                            tempDest, errorCode));
                if(U_FAILURE(errorCode)) {
                    break;
                }
            }
            spanCondition=USET_SPAN_NOT_CONTAINED;
        }
        prevSpanLimit=spanLimit;
    }
    return dest;
}